

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O0

char * skynet_command(skynet_context *context,char *cmd,char *param)

{
  int iVar1;
  char *pcVar2;
  command_func *local_30;
  command_func *method;
  char *param_local;
  char *cmd_local;
  skynet_context *context_local;
  
  local_30 = cmd_funcs;
  while( true ) {
    if (local_30->name == (char *)0x0) {
      return (char *)0x0;
    }
    iVar1 = strcmp(cmd,local_30->name);
    if (iVar1 == 0) break;
    local_30 = local_30 + 1;
  }
  pcVar2 = (*local_30->func)(context,param);
  return pcVar2;
}

Assistant:

const char * 
skynet_command(struct skynet_context * context, const char * cmd , const char * param) {
	struct command_func * method = &cmd_funcs[0];
	while(method->name) {
		if (strcmp(cmd, method->name) == 0) {
			return method->func(context, param);
		}
		++method;
	}

	return NULL;
}